

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

void bitset_shift_right(bitset_t *bitset,size_t s)

{
  ulong uVar1;
  byte bVar2;
  uint64_t *puVar3;
  size_t sVar4;
  size_t newarraysize;
  ulong uVar5;
  long lVar6;
  
  uVar5 = s >> 6;
  uVar1 = bitset->arraysize;
  bVar2 = (byte)s;
  if ((s & 0x3f) == 0) {
    newarraysize = uVar1 - uVar5;
    if (newarraysize != 0) {
      puVar3 = bitset->array;
      sVar4 = newarraysize;
      do {
        *puVar3 = puVar3[uVar5];
        puVar3 = puVar3 + 1;
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
    }
  }
  else {
    if (uVar5 + 1 < uVar1) {
      puVar3 = bitset->array;
      lVar6 = 0;
      do {
        puVar3[lVar6] =
             puVar3[uVar5 + lVar6 + 1] << (0x40 - (bVar2 & 0x3f) & 0x3f) |
             puVar3[uVar5 + lVar6] >> (bVar2 & 0x3f);
        lVar6 = lVar6 + 1;
      } while (~uVar5 + uVar1 != lVar6);
    }
    newarraysize = uVar1 - uVar5;
    bitset->array[newarraysize - 1] = bitset->array[uVar1 - 1] >> (bVar2 & 0x3f);
  }
  bitset_resize(bitset,newarraysize,false);
  return;
}

Assistant:

void bitset_shift_right(bitset_t *bitset, size_t s) {
  size_t extra_words = s / 64;
  int inword_shift = s % 64;
  size_t as = bitset->arraysize;
  if(inword_shift == 0) {
    // could be done with a memmove
    for(size_t i = 0 ; i < as - extra_words; i++) {
      bitset->array[i] = bitset->array[i + extra_words];
    }
    bitset_resize(bitset,as - extra_words, false);

  } else {
    for(size_t i = 0 ; i + extra_words + 1 < as ; i++) {
      bitset->array[i] = (bitset->array[i + extra_words] >> inword_shift)
      | (bitset->array[i + extra_words + 1] << (64 - inword_shift));
    }
    bitset->array[as - extra_words - 1] = (bitset->array[as - 1] >> inword_shift);
    bitset_resize(bitset,as - extra_words , false);
  }
}